

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O3

bool __thiscall HEkkDualRow::chooseFinalWorkGroupQuad(HEkkDualRow *this)

{
  HighsInt *__args;
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  pointer ppVar6;
  int8_t *piVar7;
  double *pdVar8;
  double *pdVar9;
  HEkk *pHVar10;
  bool bVar11;
  int workCount;
  int iVar12;
  iterator iVar13;
  pointer ppVar14;
  long lVar15;
  double selectTheta;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int local_74;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_68 = (this->ekk_instance_->options_->super_HighsOptionsStruct).dual_feasibility_tolerance;
  iVar2 = this->workCount;
  this->workCount = 0;
  local_48 = this->workDelta;
  piVar5 = (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar13._M_current =
       (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar13._M_current != piVar5) {
    (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar5;
    iVar13._M_current = piVar5;
  }
  local_48 = ABS(local_48);
  dVar19 = this->workTheta;
  local_74 = 0;
  uStack_40 = 0;
  if (iVar13._M_current ==
      (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->workGroup,iVar13,&local_74);
  }
  else {
    *iVar13._M_current = 0;
    (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar13._M_current + 1;
  }
  __args = &this->workCount;
  local_70 = &this->workData;
  dVar20 = 1e-12;
  dVar17 = local_68;
  dVar18 = local_48;
  dVar21 = 1e+100;
  workCount = this->workCount;
  while (selectTheta = dVar19, iVar12 = workCount, dVar19 < 1e+18) {
    if (workCount < iVar2) {
      ppVar6 = (this->workData).
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar7 = this->workMove;
      pdVar8 = this->workDual;
      pdVar9 = this->workRange;
      lVar15 = (long)iVar2 - (long)workCount;
      ppVar14 = ppVar6 + workCount;
      selectTheta = 1e+100;
      do {
        iVar12 = ppVar14->first;
        dVar1 = ppVar14->second;
        dVar16 = (double)(int)piVar7[iVar12] * pdVar8[iVar12];
        if (dVar16 <= dVar19 * dVar1) {
          iVar3 = *__args;
          *__args = iVar3 + 1;
          iVar4 = ppVar6[iVar3].first;
          ppVar6[iVar3].first = ppVar14->first;
          ppVar14->first = iVar4;
          dVar16 = ppVar6[iVar3].second;
          ppVar6[iVar3].second = dVar1;
          ppVar14->second = dVar16;
          dVar20 = dVar20 + dVar1 * pdVar9[iVar12];
        }
        else {
          dVar16 = dVar16 + dVar17;
          if (dVar16 < selectTheta * dVar1) {
            selectTheta = dVar16 / dVar1;
          }
        }
        ppVar14 = ppVar14 + 1;
        lVar15 = lVar15 + -1;
      } while (lVar15 != 0);
    }
    else {
      selectTheta = 1e+100;
    }
    iVar13._M_current =
         (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar13._M_current ==
        (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_60 = dVar21;
      local_58 = dVar20;
      local_50 = selectTheta;
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->workGroup,iVar13,__args);
      iVar12 = *__args;
      selectTheta = local_50;
      dVar17 = local_68;
      dVar18 = local_48;
      dVar20 = local_58;
      dVar21 = local_60;
    }
    else {
      iVar12 = this->workCount;
      *iVar13._M_current = iVar12;
      (this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar13._M_current + 1;
    }
    if ((iVar12 == workCount) && (dVar19 == selectTheta)) {
      if ((dVar21 == selectTheta) && (!NAN(dVar21) && !NAN(selectTheta))) {
        pHVar10 = this->ekk_instance_;
        debugDualChuzcFailQuad0
                  (pHVar10->options_,workCount,local_70,
                   (pHVar10->lp_).num_row_ + (pHVar10->lp_).num_col_,this->workDual,selectTheta,
                   selectTheta,true);
        goto LAB_00355a4d;
      }
    }
    if ((dVar18 <= dVar20) ||
       (dVar19 = selectTheta, dVar21 = selectTheta, workCount = iVar12, iVar12 == iVar2)) break;
  }
  bVar11 = true;
  if ((int)((ulong)((long)(this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->workGroup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2) < 2) {
    pHVar10 = this->ekk_instance_;
    debugDualChuzcFailQuad1
              (pHVar10->options_,iVar12,local_70,(pHVar10->lp_).num_row_ + (pHVar10->lp_).num_col_,
               this->workDual,selectTheta,true);
LAB_00355a4d:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool HEkkDualRow::chooseFinalWorkGroupQuad() {
  const double Td = ekk_instance_.options_->dual_feasibility_tolerance;
  HighsInt fullCount = workCount;
  workCount = 0;
  double totalChange = kInitialTotalChange;
  double selectTheta = workTheta;
  const double totalDelta = fabs(workDelta);
  workGroup.clear();
  workGroup.push_back(0);
  HighsInt prev_workCount = workCount;
  double prev_remainTheta = kInitialRemainTheta;
  double prev_selectTheta = selectTheta;

  while (selectTheta < kMaxSelectTheta) {
    double remainTheta = kInitialRemainTheta;
    for (HighsInt i = workCount; i < fullCount; i++) {
      HighsInt iCol = workData[i].first;
      double value = workData[i].second;
      double dual = workMove[iCol] * workDual[iCol];
      // Tight satisfy
      if (dual <= selectTheta * value) {
        swap(workData[workCount++], workData[i]);
        totalChange += value * (workRange[iCol]);
      } else if (dual + Td < remainTheta * value) {
        remainTheta = (dual + Td) / value;
      }
    }
    workGroup.push_back(workCount);

    // Update selectTheta with the value of remainTheta;
    selectTheta = remainTheta;
    // Check for no change in this loop - to prevent infinite loop
    if ((workCount == prev_workCount) && (prev_selectTheta == selectTheta) &&
        (prev_remainTheta == remainTheta)) {
      HighsInt num_var =
          ekk_instance_.lp_.num_col_ + ekk_instance_.lp_.num_row_;
      debugDualChuzcFailQuad0(*ekk_instance_.options_, workCount, workData,
                              num_var, workDual, selectTheta, remainTheta,
                              true);
      return false;
    }
    // Record the initial values of workCount, remainTheta and selectTheta for
    // the next pass through the loop - to check for infinite loop condition
    prev_workCount = workCount;
    prev_remainTheta = remainTheta;
    prev_selectTheta = selectTheta;
    if (totalChange >= totalDelta || workCount == fullCount) break;
  }
  // Check that at least one group has been identified
  if ((HighsInt)workGroup.size() <= 1) {
    HighsInt num_var = ekk_instance_.lp_.num_col_ + ekk_instance_.lp_.num_row_;
    debugDualChuzcFailQuad1(*ekk_instance_.options_, workCount, workData,
                            num_var, workDual, selectTheta, true);
    return false;
  }
  return true;
}